

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void * nk_buffer_realloc(nk_buffer *b,nk_size capacity,nk_size *size)

{
  nk_size nVar1;
  nk_size back_size;
  void *src;
  void *dst;
  nk_size buffer_size;
  void *temp;
  nk_size *size_local;
  nk_size capacity_local;
  nk_buffer *b_local;
  
  if (b == (nk_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x1fa3,"void *nk_buffer_realloc(struct nk_buffer *, nk_size, nk_size *)");
  }
  if (size != (nk_size *)0x0) {
    if ((((b == (nk_buffer *)0x0) || (size == (nk_size *)0x0)) ||
        ((b->pool).alloc == (nk_plugin_alloc)0x0)) || ((b->pool).free == (nk_plugin_free)0x0)) {
      b_local = (nk_buffer *)0x0;
    }
    else {
      nVar1 = (b->memory).size;
      b_local = (nk_buffer *)(*(b->pool).alloc)((b->pool).userdata,(b->memory).ptr,capacity);
      if (b_local == (nk_buffer *)0x0) {
        __assert_fail("temp",
                      "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                      ,0x1faa,"void *nk_buffer_realloc(struct nk_buffer *, nk_size, nk_size *)");
      }
      if (b_local == (nk_buffer *)0x0) {
        b_local = (nk_buffer *)0x0;
      }
      else {
        *size = capacity;
        if (b_local != (nk_buffer *)(b->memory).ptr) {
          nk_memcopy(b_local,(b->memory).ptr,nVar1);
          (*(b->pool).free)((b->pool).userdata,(b->memory).ptr);
        }
        if (b->size == nVar1) {
          b->size = capacity;
        }
        else {
          nVar1 = nVar1 - b->size;
          nk_memcopy((void *)((long)b_local + (capacity - nVar1)),
                     (void *)((long)&b_local->marker[0].active + b->size),nVar1);
          b->size = capacity - nVar1;
        }
      }
    }
    return b_local;
  }
  __assert_fail("size",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x1fa4,"void *nk_buffer_realloc(struct nk_buffer *, nk_size, nk_size *)");
}

Assistant:

NK_LIB void*
nk_buffer_realloc(struct nk_buffer *b, nk_size capacity, nk_size *size)
{
    void *temp;
    nk_size buffer_size;

    NK_ASSERT(b);
    NK_ASSERT(size);
    if (!b || !size || !b->pool.alloc || !b->pool.free)
        return 0;

    buffer_size = b->memory.size;
    temp = b->pool.alloc(b->pool.userdata, b->memory.ptr, capacity);
    NK_ASSERT(temp);
    if (!temp) return 0;

    *size = capacity;
    if (temp != b->memory.ptr) {
        NK_MEMCPY(temp, b->memory.ptr, buffer_size);
        b->pool.free(b->pool.userdata, b->memory.ptr);
    }

    if (b->size == buffer_size) {
        /* no back buffer so just set correct size */
        b->size = capacity;
        return temp;
    } else {
        /* copy back buffer to the end of the new buffer */
        void *dst, *src;
        nk_size back_size;
        back_size = buffer_size - b->size;
        dst = nk_ptr_add(void, temp, capacity - back_size);
        src = nk_ptr_add(void, temp, b->size);
        NK_MEMCPY(dst, src, back_size);
        b->size = capacity - back_size;
    }
    return temp;
}